

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O3

void __thiscall
S2CellId::AppendAllNeighbors
          (S2CellId *this,int nbr_level,vector<S2CellId,_std::allocator<S2CellId>_> *output)

{
  ulong uVar1;
  iterator iVar2;
  bool bVar3;
  ulong uVar4;
  int face;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  S2CellId local_88;
  int local_7c;
  S2LogMessage local_78;
  int local_68;
  int local_64;
  ulong local_60;
  int local_54;
  uint local_50;
  int local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  uVar1 = this->id_;
  if (uVar1 == 0) {
    S2LogMessage::S2LogMessage
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x223,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_78.stream_,"Check failed: id_ != 0 ",0x17);
  }
  else {
    uVar4 = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    if (nbr_level < (int)(0x1e - ((uint)(uVar4 >> 1) & 0x7fffffff))) {
      S2LogMessage::S2LogMessage
                (&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.cc"
                 ,0x223,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_78.stream_,"Check failed: (nbr_level) >= (level()) ",0x27);
    }
    else {
      face = ToFaceIJOrientation(this,(int *)&local_44,(int *)&local_48,(int *)0x0);
      uVar1 = this->id_;
      if (uVar1 == 0) {
        S2LogMessage::S2LogMessage
                  (&local_78,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                   ,0x223,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_78.stream_,"Check failed: id_ != 0 ",0x17);
      }
      else {
        uVar4 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        iVar7 = 1 << ((byte)(uVar4 >> 1) & 0x1f);
        uVar5 = 1 << (0x1eU - (char)nbr_level & 0x1f);
        local_38 = (ulong)uVar5;
        if ((int)uVar5 <= iVar7) {
          local_44 = local_44 & -iVar7;
          local_40 = (ulong)local_44;
          local_48 = -iVar7 & local_48;
          local_60 = (ulong)local_48;
          iVar9 = -uVar5;
          local_50 = ~local_48;
          local_68 = local_48 - uVar5;
          local_54 = local_48 + iVar7;
          local_64 = local_44 - uVar5;
          local_4c = local_44 + iVar7;
          iVar6 = uVar5 * -2;
          local_7c = nbr_level;
          do {
            if (iVar9 < 0) {
              bVar3 = (int)local_50 < iVar9;
            }
            else if (iVar9 < iVar7) {
              iVar8 = (int)local_40 + iVar9;
              if ((int)local_60 < iVar7) {
                local_88 = FromFaceIJWrap(face,iVar8,local_68);
              }
              else {
                local_88 = FromFaceIJ(face,iVar8,local_68);
              }
              local_78._0_8_ = parent(&local_88,nbr_level);
              iVar2._M_current =
                   (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<S2CellId,_std::allocator<S2CellId>_>::_M_realloc_insert<S2CellId>
                          (output,iVar2,(S2CellId *)&local_78);
              }
              else {
                (iVar2._M_current)->id_ = local_78._0_8_;
                (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar2._M_current + 1;
              }
              if (local_54 < 0x40000000) {
                local_88 = FromFaceIJ(face,iVar8,local_54);
              }
              else {
                local_88 = FromFaceIJWrap(face,iVar8,local_54);
              }
              local_78._0_8_ = parent(&local_88,nbr_level);
              iVar2._M_current =
                   (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<S2CellId,_std::allocator<S2CellId>_>::_M_realloc_insert<S2CellId>
                          (output,iVar2,(S2CellId *)&local_78);
              }
              else {
                (iVar2._M_current)->id_ = local_78._0_8_;
                (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar2._M_current + 1;
              }
              bVar3 = true;
            }
            else {
              bVar3 = (int)local_60 + iVar9 < 0x40000000;
            }
            iVar8 = (int)local_60 + iVar9;
            if (((int)local_40 < iVar7) || (!bVar3)) {
              local_88 = FromFaceIJWrap(face,local_64,iVar8);
            }
            else {
              local_88 = FromFaceIJ(face,local_64,iVar8);
            }
            local_78._0_8_ = parent(&local_88,local_7c);
            iVar2._M_current =
                 (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<S2CellId,_std::allocator<S2CellId>_>::_M_realloc_insert<S2CellId>
                        (output,iVar2,(S2CellId *)&local_78);
            }
            else {
              (iVar2._M_current)->id_ = local_78._0_8_;
              (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            if ((bool)(bVar3 ^ 1U | 0x3fffffff < local_4c)) {
              local_88 = FromFaceIJWrap(face,local_4c,iVar8);
            }
            else {
              local_88 = FromFaceIJ(face,local_4c,iVar8);
            }
            nbr_level = local_7c;
            local_78._0_8_ = parent(&local_88,local_7c);
            uVar1 = local_38;
            iVar2._M_current =
                 (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<S2CellId,_std::allocator<S2CellId>_>::_M_realloc_insert<S2CellId>
                        (output,iVar2,(S2CellId *)&local_78);
            }
            else {
              (iVar2._M_current)->id_ = local_78._0_8_;
              (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar9 = iVar9 + (int)uVar1;
            iVar6 = iVar6 + (int)uVar1;
          } while (iVar6 < iVar7);
          return;
        }
        S2LogMessage::S2LogMessage
                  (&local_78,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.cc"
                   ,0x22f,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_78.stream_,"Check failed: (nbr_size) <= (size) ",0x23);
      }
    }
  }
  abort();
}

Assistant:

void S2CellId::AppendAllNeighbors(int nbr_level,
                                  vector<S2CellId>* output) const {
  S2_DCHECK_GE(nbr_level, level());
  int i, j;
  int face = ToFaceIJOrientation(&i, &j, nullptr);

  // Find the coordinates of the lower left-hand leaf cell.  We need to
  // normalize (i,j) to a known position within the cell because nbr_level
  // may be larger than this cell's level.
  int size = GetSizeIJ();
  i &= -size;
  j &= -size;

  int nbr_size = GetSizeIJ(nbr_level);
  S2_DCHECK_LE(nbr_size, size);

  // We compute the top-bottom, left-right, and diagonal neighbors in one
  // pass.  The loop test is at the end of the loop to avoid 32-bit overflow.
  for (int k = -nbr_size; ; k += nbr_size) {
    bool same_face;
    if (k < 0) {
      same_face = (j + k >= 0);
    } else if (k >= size) {
      same_face = (j + k < kMaxSize);
    } else {
      same_face = true;
      // Top and bottom neighbors.
      output->push_back(FromFaceIJSame(face, i + k, j - nbr_size,
                                       j - size >= 0).parent(nbr_level));
      output->push_back(FromFaceIJSame(face, i + k, j + size,
                                       j + size < kMaxSize).parent(nbr_level));
    }
    // Left, right, and diagonal neighbors.
    output->push_back(FromFaceIJSame(face, i - nbr_size, j + k,
                                     same_face && i - size >= 0)
                      .parent(nbr_level));
    output->push_back(FromFaceIJSame(face, i + size, j + k,
                                     same_face && i + size < kMaxSize)
                      .parent(nbr_level));
    if (k >= size) break;
  }
}